

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O0

void __thiscall
tchecker::
size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::declare(size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,uint id,string *name,clock_info_t *info)

{
  size_t_conflict sVar1;
  invalid_argument *piVar2;
  size_t_conflict size;
  clock_info_t *info_local;
  string *name_local;
  uint id_local;
  size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  if (id < this->_next_id) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Variable identifier is already used");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar1 = size_info_t::size(&info->super_size_info_t);
  if (id + sVar1 < id) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Not enough variable identifiers left");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::declare(&this->
             super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ,id,name,info);
  if ((id < this->_first_id) || (this->_first_id == this->_next_id)) {
    this->_first_id = id;
  }
  this->_next_id = id + sVar1;
  return;
}

Assistant:

void declare(ID id, std::string const & name, INFO const & info)
  {
    if (id < _next_id)
      throw std::invalid_argument("Variable identifier is already used");

    typename INFO::size_t size = info.size();

    if (id + size < id) // overflow
      throw std::invalid_argument("Not enough variable identifiers left");

    tchecker::variables_t<ID, INFO, INDEX>::declare(id, name, info);
    if ((id < _first_id) || (_first_id == _next_id))
      _first_id = id;
    _next_id = id + size;
  }